

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O2

Result * __thiscall
S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell
          (Result *__return_storage_ptr__,S2ClosestCellQueryBase<S2MinDistance> *this,Target *target
          ,Options *options)

{
  uint64 uVar1;
  undefined4 uVar2;
  S2LogMessage local_20;
  
  if (options->max_results_ == 1) {
    FindClosestCellsInternal(this,target,options);
    uVar2 = *(undefined4 *)&(this->result_singleton_).field_0x14;
    __return_storage_ptr__->label_ = (this->result_singleton_).label_;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar2;
    uVar1 = (this->result_singleton_).cell_id_.id_;
    (__return_storage_ptr__->distance_).super_S1ChordAngle.length2_ =
         (this->result_singleton_).distance_.super_S1ChordAngle.length2_;
    (__return_storage_ptr__->cell_id_).id_ = uVar1;
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_cell_query_base.h"
             ,0x1ea,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: (options.max_results()) == (1) ");
  abort();
}

Assistant:

typename S2ClosestCellQueryBase<Distance>::Result
S2ClosestCellQueryBase<Distance>::FindClosestCell(
    Target* target, const Options& options) {
  S2_DCHECK_EQ(options.max_results(), 1);
  FindClosestCellsInternal(target, options);
  return result_singleton_;
}